

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_add_mem_to_archive_file_in_place
                  (char *pZip_filename,char *pArchive_name,void *pBuf,size_t buf_size,void *pComment
                  ,mz_uint16 comment_size,mz_uint level_and_flags)

{
  bool bVar1;
  mz_bool mVar2;
  int iVar3;
  undefined1 local_138 [4];
  int ignoredStatus;
  stat file_stat;
  mz_zip_archive zip_archive;
  mz_bool local_40;
  mz_bool created_new_archive;
  mz_bool status;
  mz_uint16 comment_size_local;
  void *pComment_local;
  size_t buf_size_local;
  void *pBuf_local;
  char *pArchive_name_local;
  char *pZip_filename_local;
  
  bVar1 = false;
  memset(file_stat.__glibc_reserved + 2,0,0x60);
  if ((int)level_and_flags < 0) {
    level_and_flags = 6;
  }
  if ((((pZip_filename == (char *)0x0) || (pArchive_name == (char *)0x0)) ||
      ((buf_size != 0 && (pBuf == (void *)0x0)))) ||
     (((comment_size != 0 && (pComment == (void *)0x0)) || (10 < (level_and_flags & 0xf))))) {
    pZip_filename_local._4_4_ = 0;
  }
  else {
    mVar2 = mz_zip_writer_validate_archive_name(pArchive_name);
    if (mVar2 == 0) {
      pZip_filename_local._4_4_ = 0;
    }
    else {
      iVar3 = stat(pZip_filename,(stat *)local_138);
      if (iVar3 == 0) {
        mVar2 = mz_zip_reader_init_file
                          ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pZip_filename,
                           level_and_flags | 0x800);
        if (mVar2 == 0) {
          return 0;
        }
        mVar2 = mz_zip_writer_init_from_reader
                          ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pZip_filename);
        if (mVar2 == 0) {
          mz_zip_reader_end((mz_zip_archive *)(file_stat.__glibc_reserved + 2));
          return 0;
        }
      }
      else {
        mVar2 = mz_zip_writer_init_file
                          ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pZip_filename,0);
        if (mVar2 == 0) {
          return 0;
        }
        bVar1 = true;
      }
      local_40 = mz_zip_writer_add_mem_ex
                           ((mz_zip_archive *)(file_stat.__glibc_reserved + 2),pArchive_name,pBuf,
                            buf_size,pComment,comment_size,level_and_flags,0,0);
      mVar2 = mz_zip_writer_finalize_archive((mz_zip_archive *)(file_stat.__glibc_reserved + 2));
      if (mVar2 == 0) {
        local_40 = 0;
      }
      mVar2 = mz_zip_writer_end((mz_zip_archive *)(file_stat.__glibc_reserved + 2));
      if (mVar2 == 0) {
        local_40 = 0;
      }
      if ((local_40 == 0) && (bVar1)) {
        remove(pZip_filename);
      }
      pZip_filename_local._4_4_ = local_40;
    }
  }
  return pZip_filename_local._4_4_;
}

Assistant:

mz_bool mz_zip_add_mem_to_archive_file_in_place(
    const char *pZip_filename, const char *pArchive_name, const void *pBuf,
    size_t buf_size, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags) {
  mz_bool status, created_new_archive = MZ_FALSE;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  MZ_CLEAR_OBJ(zip_archive);
  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  if ((!pZip_filename) || (!pArchive_name) || ((buf_size) && (!pBuf)) ||
      ((comment_size) && (!pComment)) ||
      ((level_and_flags & 0xF) > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;
  if (MZ_FILE_STAT(pZip_filename, &file_stat) != 0) {
    // Create a new archive.
    if (!mz_zip_writer_init_file(&zip_archive, pZip_filename, 0))
      return MZ_FALSE;
    created_new_archive = MZ_TRUE;
  } else {
    // Append to an existing archive.
    if (!mz_zip_reader_init_file(&zip_archive, pZip_filename,
                                 level_and_flags |
                                     MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY))
      return MZ_FALSE;
    if (!mz_zip_writer_init_from_reader(&zip_archive, pZip_filename)) {
      mz_zip_reader_end(&zip_archive);
      return MZ_FALSE;
    }
  }
  status =
      mz_zip_writer_add_mem_ex(&zip_archive, pArchive_name, pBuf, buf_size,
                               pComment, comment_size, level_and_flags, 0, 0);
  // Always finalize, even if adding failed for some reason, so we have a valid
  // central directory. (This may not always succeed, but we can try.)
  if (!mz_zip_writer_finalize_archive(&zip_archive))
    status = MZ_FALSE;
  if (!mz_zip_writer_end(&zip_archive))
    status = MZ_FALSE;
  if ((!status) && (created_new_archive)) {
    // It's a new archive and something went wrong, so just delete it.
    int ignoredStatus = MZ_DELETE_FILE(pZip_filename);
    (void)ignoredStatus;
  }
  return status;
}